

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O0

string * __thiscall
yactfr::internal::ReadFlUIntInstr::_toStr_abi_cxx11_
          (string *__return_storage_ptr__,ReadFlUIntInstr *this,Size param_1)

{
  ostream *this_00;
  string local_1b8;
  ostringstream local_198 [8];
  ostringstream ss;
  Size param_1_local;
  ReadFlUIntInstr *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  ReadFlBitArrayInstr::_commonToStr_abi_cxx11_(&local_1b8,(ReadFlBitArrayInstr *)this);
  this_00 = std::operator<<((ostream *)local_198,(string *)&local_1b8);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string ReadFlUIntInstr::_toStr(Size) const
{
    std::ostringstream ss;

    ss << this->_commonToStr() << std::endl;
    return ss.str();
}